

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_address.cpp
# Opt level: O2

void __thiscall miniros::network::NetAddress::NetAddress(NetAddress *this,NetAddress *other)

{
  Type TVar1;
  Type TVar2;
  void *__dest;
  size_t sVar3;
  size_t __size;
  
  this->type = AddressInvalid;
  (this->address)._M_dataplus._M_p = (pointer)&(this->address).field_2;
  (this->address)._M_string_length = 0;
  (this->address).field_2._M_local_buf[0] = '\0';
  this->port = 0;
  this->rawAddress = (void *)0x0;
  TVar2 = AddressInvalid;
  if ((other->rawAddress != (void *)0x0) && (TVar1 = other->type, TVar1 - AddressIPv4 < 2)) {
    sVar3 = 0x1c;
    if (TVar1 != AddressIPv6) {
      sVar3 = 0;
    }
    __size = 0x10;
    if (TVar1 != AddressIPv4) {
      __size = sVar3;
    }
    __dest = malloc(__size);
    this->rawAddress = __dest;
    memcpy(__dest,other->rawAddress,__size);
    TVar2 = TVar1;
  }
  this->type = TVar2;
  this->port = other->port;
  std::__cxx11::string::_M_assign((string *)&this->address);
  return;
}

Assistant:

NetAddress::NetAddress(const NetAddress& other)
{
  if (other.rawAddress && (other.type == Type::AddressIPv4 || other.type == Type::AddressIPv6)) {
    size_t size = getAddressSize(other.type);
    sockaddr_in* addr = static_cast<sockaddr_in*>(malloc(size));
    rawAddress = addr;
    memcpy(rawAddress, other.rawAddress, getAddressSize(other.type));
    type = other.type;
  } else {
    type = Type::AddressInvalid;
  }
  port = other.port;
  address = other.address;
}